

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall
presolve::HPresolve::changeImplColUpper
          (HPresolve *this,HighsInt col,double newUpper,HighsInt originRow)

{
  bool bVar1;
  uint uVar2;
  reference pvVar3;
  reference pvVar4;
  double *pdVar5;
  HighsLinearSumBounds *this_00;
  char *pcVar6;
  int in_EDX;
  int __c;
  int __c_00;
  int __c_01;
  int extraout_EDX;
  int __c_02;
  int in_ESI;
  iterator *rhs;
  long *in_RDI;
  value_type in_XMM0_Qa;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar7;
  HighsSliceNonzero *nonzero;
  iterator __end1;
  iterator __begin1;
  HighsTripletListSlice *__range1;
  bool newImpliedFree;
  HighsInt oldUpperSource;
  double oldImplUpper;
  long *in_stack_fffffffffffffee8;
  HPresolve *in_stack_fffffffffffffef0;
  HPresolve *this_01;
  HighsInt in_stack_fffffffffffffefc;
  int row;
  HPresolve *in_stack_ffffffffffffff00;
  int *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  value_type in_stack_ffffffffffffff14;
  value_type in_stack_ffffffffffffff18;
  HighsInt col_00;
  HPresolve *in_stack_ffffffffffffff20;
  bool local_d1;
  value_type in_stack_ffffffffffffff30;
  HPresolve *oldImplVarUpper;
  HighsInt in_stack_ffffffffffffff48;
  HighsInt in_stack_ffffffffffffff4c;
  iterator local_a8;
  iterator local_88;
  undefined1 local_68 [32];
  undefined1 *local_48;
  _Base_ptr local_40;
  undefined1 local_38;
  bool local_2d;
  value_type local_2c;
  HPresolve *local_28;
  int local_1c;
  value_type local_18;
  int local_c;
  
  local_1c = in_EDX;
  local_18 = in_XMM0_Qa;
  local_c = in_ESI;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x35),(long)in_ESI);
  local_28 = (HPresolve *)*pvVar3;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x3b),(long)local_c);
  local_2c = *pvVar4;
  oldImplVarUpper = local_28;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),(long)local_c);
  if ((*pvVar3 - (double)in_RDI[4] <= (double)oldImplVarUpper) &&
     (in_stack_ffffffffffffff30 = local_18,
     pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),(long)local_c),
     in_stack_ffffffffffffff30 < *pvVar3 - (double)in_RDI[4])) {
    markChangedCol(in_stack_fffffffffffffef0,(HighsInt)((ulong)in_stack_fffffffffffffee8 >> 0x20));
  }
  bVar1 = isLowerImplied(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  local_d1 = false;
  if (bVar1) {
    in_stack_ffffffffffffff20 = local_28;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),(long)local_c);
    local_d1 = false;
    if (*pvVar3 + (double)in_RDI[4] < (double)in_stack_ffffffffffffff20) {
      in_stack_ffffffffffffff18 = local_18;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),(long)local_c)
      ;
      local_d1 = in_stack_ffffffffffffff18 <= *pvVar3 + (double)in_RDI[4];
    }
  }
  col_00 = (HighsInt)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  local_2d = local_d1;
  if (local_2c != local_1c) {
    if ((local_2c != -1) &&
       (in_stack_ffffffffffffff14 = local_2c,
       pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x38),(long)local_c),
       in_stack_ffffffffffffff14 != *pvVar4)) {
      std::
      vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
      ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                    *)(in_RDI + 0x50),(long)local_2c);
      std::set<int,_std::less<int>,_std::allocator<int>_>::erase
                ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffef0,
                 (key_type_conflict1 *)in_stack_fffffffffffffee8);
    }
    if (local_1c != -1) {
      std::
      vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
      ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                    *)(in_RDI + 0x50),(long)local_1c);
      pVar7 = std::set<int,std::less<int>,std::allocator<int>>::emplace<int&>
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)
                         CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                         in_stack_ffffffffffffff08);
      local_40 = (_Base_ptr)pVar7.first._M_node;
      local_38 = pVar7.second;
    }
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x3b),(long)local_c);
    *pvVar4 = local_1c;
  }
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x35),(long)local_c);
  *pvVar3 = local_18;
  if ((local_2d & 1U) == 0) {
    pdVar5 = std::min<double>((double *)&local_28,&local_18);
    in_stack_ffffffffffffff00 = (HPresolve *)*pdVar5;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),(long)local_c);
    if (*pvVar3 <= (double)in_stack_ffffffffffffff00) {
      return;
    }
  }
  getColumnVector(in_stack_ffffffffffffff20,col_00);
  local_48 = local_68;
  HighsMatrixSlice<HighsTripletListSlice>::begin
            ((HighsMatrixSlice<HighsTripletListSlice> *)in_stack_fffffffffffffef0);
  HighsMatrixSlice<HighsTripletListSlice>::end
            ((HighsMatrixSlice<HighsTripletListSlice> *)in_stack_fffffffffffffef0);
  while( true ) {
    rhs = &local_a8;
    bVar1 = HighsMatrixSlice<HighsTripletListSlice>::iterator::operator!=(&local_88,rhs);
    if (!bVar1) break;
    this_00 = (HighsLinearSumBounds *)
              HighsMatrixSlice<HighsTripletListSlice>::iterator::operator*(&local_88);
    this_01 = (HPresolve *)(in_RDI + 0x56);
    pcVar6 = HighsSliceNonzero::index((HighsSliceNonzero *)this_00,(char *)rhs,__c);
    uVar2 = (uint)pcVar6;
    row = local_c;
    HighsSliceNonzero::value((HighsSliceNonzero *)this_00);
    pcVar6 = (char *)(ulong)uVar2;
    HighsLinearSumBounds::updatedImplVarUpper
              (this_00,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,(double)in_RDI,
               (double)oldImplVarUpper,(HighsInt)((ulong)in_stack_ffffffffffffff30 >> 0x20));
    __c_02 = __c_00;
    if ((local_2d & 1U) != 0) {
      pcVar6 = HighsSliceNonzero::index((HighsSliceNonzero *)this_00,pcVar6,__c_00);
      pcVar6 = (char *)((ulong)pcVar6 & 0xffffffff);
      bVar1 = isDualImpliedFree(in_stack_ffffffffffffff00,row);
      __c_02 = __c_01;
      if (bVar1) {
        in_stack_fffffffffffffee8 = in_RDI + 0x9e;
        pcVar6 = HighsSliceNonzero::index((HighsSliceNonzero *)this_00,pcVar6,__c_01);
        in_stack_ffffffffffffff4c = (HighsInt)pcVar6;
        pcVar6 = &stack0xffffffffffffff4c;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int&>
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   in_stack_ffffffffffffff00,(int *)CONCAT44(row,uVar2),(int *)this_01);
        __c_02 = extraout_EDX;
      }
    }
    HighsSliceNonzero::index((HighsSliceNonzero *)this_00,pcVar6,__c_02);
    markChangedRow(this_01,(HighsInt)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    HighsMatrixSlice<HighsTripletListSlice>::iterator::operator++(&local_88);
  }
  return;
}

Assistant:

void HPresolve::changeImplColUpper(HighsInt col, double newUpper,
                                   HighsInt originRow) {
  double oldImplUpper = implColUpper[col];
  HighsInt oldUpperSource = colUpperSource[col];
  if (oldImplUpper >= model->col_upper_[col] - primal_feastol &&
      newUpper < model->col_upper_[col] - primal_feastol) {
    // the dual constraint can be considered a >= constraint and was free, or a
    // <= constraint before
    markChangedCol(col);
  }
  bool newImpliedFree =
      isLowerImplied(col) &&
      oldImplUpper > model->col_upper_[col] + primal_feastol &&
      newUpper <= model->col_upper_[col] + primal_feastol;

  // remember the source of this upper bound, so that we can correctly identify
  // weak domination
  if (oldUpperSource != originRow) {
    if (oldUpperSource != -1 && oldUpperSource != colLowerSource[col])
      colImplSourceByRow[oldUpperSource].erase(col);
    if (originRow != -1) colImplSourceByRow[originRow].emplace(col);

    colUpperSource[col] = originRow;
  }

  // update implied bound
  implColUpper[col] = newUpper;

  // if the old and the new implied bound are not better than the upper bound,
  // nothing needs to be updated
  if (!newImpliedFree &&
      std::min(oldImplUpper, newUpper) >= model->col_upper_[col])
    return;

  for (const HighsSliceNonzero& nonzero : getColumnVector(col)) {
    impliedRowBounds.updatedImplVarUpper(nonzero.index(), col, nonzero.value(),
                                         oldImplUpper, oldUpperSource);
    if (newImpliedFree && isDualImpliedFree(nonzero.index()))
      substitutionOpportunities.emplace_back(nonzero.index(), col);

    markChangedRow(nonzero.index());
  }
}